

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetSpatialGraphNodeBindingPropertiesMSFT
                   (XrSpatialGraphNodeBindingMSFT nodeBinding,
                   XrSpatialGraphNodeBindingPropertiesGetInfoMSFT *getInfo,
                   XrSpatialGraphNodeBindingPropertiesMSFT *properties)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  XrResult XVar3;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  XrSpatialGraphNodeBindingMSFT_T *in_stack_fffffffffffffd78;
  string local_280;
  string local_260;
  XrSpatialGraphNodeBindingMSFT nodeBinding_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_218;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3b9b8968;
  nodeBinding_local = nodeBinding;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSpatialGraphNodeBindingMSFT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&nodeBinding_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSpatialGraphNodeBindingMSFTHandle(&nodeBinding_local);
  if (VVar1 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSpatialGraphNodeBindingMSFT handle \"nodeBinding\" ")
    ;
    HandleToHexString<XrSpatialGraphNodeBindingMSFT_T*>(in_stack_fffffffffffffd78);
    std::operator<<((ostream *)&oss,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string
              ((string *)&local_280,
               "VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-nodeBinding-parameter",
               (allocator *)&stack0xfffffffffffffd7f);
    std::__cxx11::string::string
              ((string *)&local_260,"xrGetSpatialGraphNodeBindingPropertiesMSFT",
               (allocator *)&stack0xfffffffffffffd7e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_280,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
    goto LAB_001d5ab7;
  }
  pVar4 = HandleInfo<XrSpatialGraphNodeBindingMSFT_T_*>::getWithInstanceInfo
                    (&g_spatialgraphnodebindingmsft_info,nodeBinding_local);
  instance_info = pVar4.second;
  if (getInfo == (XrSpatialGraphNodeBindingPropertiesGetInfoMSFT *)0x0) {
LAB_001d591c:
    if (properties == (XrSpatialGraphNodeBindingPropertiesMSFT *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,
                 "VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-properties-parameter",
                 (allocator *)&local_218);
      std::__cxx11::string::string
                ((string *)&local_280,"xrGetSpatialGraphNodeBindingPropertiesMSFT",
                 (allocator *)&stack0xfffffffffffffd7f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_260,
                 "Invalid NULL for XrSpatialGraphNodeBindingPropertiesMSFT \"properties\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd7e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      this = &local_1e0;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrGetSpatialGraphNodeBindingPropertiesMSFT",(allocator *)&local_280
                );
      XVar2 = XR_SUCCESS;
      XVar3 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,properties);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar3 == XR_SUCCESS) goto LAB_001d5ab7;
      std::__cxx11::string::string
                ((string *)&oss,
                 "VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-properties-parameter",
                 (allocator *)&local_218);
      std::__cxx11::string::string
                ((string *)&local_280,"xrGetSpatialGraphNodeBindingPropertiesMSFT",
                 (allocator *)&stack0xfffffffffffffd7f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_260,
                 "Command xrGetSpatialGraphNodeBindingPropertiesMSFT param properties is invalid",
                 (allocator *)&stack0xfffffffffffffd7e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f8,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      this = &local_1f8;
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&oss,"xrGetSpatialGraphNodeBindingPropertiesMSFT",(allocator *)&local_280);
    XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,getInfo);
    std::__cxx11::string::~string((string *)&oss);
    if (XVar2 == XR_SUCCESS) goto LAB_001d591c;
    std::__cxx11::string::string
              ((string *)&oss,"VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-getInfo-parameter",
               (allocator *)&local_218);
    std::__cxx11::string::string
              ((string *)&local_280,"xrGetSpatialGraphNodeBindingPropertiesMSFT",
               (allocator *)&stack0xfffffffffffffd7f);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c8,&objects_info);
    std::__cxx11::string::string
              ((string *)&local_260,
               "Command xrGetSpatialGraphNodeBindingPropertiesMSFT param getInfo is invalid",
               (allocator *)&stack0xfffffffffffffd7e);
    CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c8,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    this = &local_1c8;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&oss);
  XVar2 = XR_ERROR_VALIDATION_FAILURE;
LAB_001d5ab7:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrGetSpatialGraphNodeBindingPropertiesMSFT(
XrSpatialGraphNodeBindingMSFT nodeBinding,
const XrSpatialGraphNodeBindingPropertiesGetInfoMSFT* getInfo,
XrSpatialGraphNodeBindingPropertiesMSFT* properties) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(nodeBinding, XR_OBJECT_TYPE_SPATIAL_GRAPH_NODE_BINDING_MSFT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpatialGraphNodeBindingMSFTHandle(&nodeBinding);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpatialGraphNodeBindingMSFT handle \"nodeBinding\" ";
                oss << HandleToHexString(nodeBinding);
                CoreValidLogMessage(nullptr, "VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-nodeBinding-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSpatialGraphNodeBindingPropertiesMSFT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_spatialgraphnodebindingmsft_info.getWithInstanceInfo(nodeBinding);
        GenValidUsageXrHandleInfo *gen_spatialgraphnodebindingmsft_info = info_with_instance.first;
        (void)gen_spatialgraphnodebindingmsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Validate that the structure XrSpatialGraphNodeBindingPropertiesGetInfoMSFT is valid
        if (nullptr != getInfo) {
            xr_result = ValidateXrStruct(gen_instance_info, "xrGetSpatialGraphNodeBindingPropertiesMSFT",
                                                            objects_info, false, true, getInfo);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(gen_instance_info, "VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-getInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSpatialGraphNodeBindingPropertiesMSFT",
                                    objects_info,
                                    "Command xrGetSpatialGraphNodeBindingPropertiesMSFT param getInfo is invalid");
                return xr_result;
            }
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == properties) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-properties-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSpatialGraphNodeBindingPropertiesMSFT", objects_info,
                                "Invalid NULL for XrSpatialGraphNodeBindingPropertiesMSFT \"properties\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSpatialGraphNodeBindingPropertiesMSFT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetSpatialGraphNodeBindingPropertiesMSFT", objects_info,
                                                        false, true, properties);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSpatialGraphNodeBindingPropertiesMSFT-properties-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSpatialGraphNodeBindingPropertiesMSFT",
                                objects_info,
                                "Command xrGetSpatialGraphNodeBindingPropertiesMSFT param properties is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}